

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int decode_session_identifier
              (uint64_t *issued_at,ptls_iovec_t *psk,uint32_t *ticket_age_add,
              ptls_iovec_t *server_name,uint16_t *csid,uint8_t *src,uint8_t *end)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint8_t *end_00;
  ushort *local_40;
  ptls_iovec_t *local_38;
  
  iVar1 = 0x32;
  iVar2 = iVar1;
  if (1 < (ulong)((long)end - (long)src)) {
    uVar3 = (ulong)(ushort)(*(ushort *)src << 8 | *(ushort *)src >> 8);
    local_40 = (ushort *)(src + 2);
    if (uVar3 <= (ulong)((long)end - (long)local_40)) {
      end_00 = (uint8_t *)((long)local_40 + uVar3);
      local_38 = server_name;
      iVar2 = decode64(issued_at,(uint8_t **)&local_40,end_00);
      if ((iVar2 == 0) && (iVar2 = iVar1, 1 < (ulong)((long)end_00 - (long)local_40))) {
        uVar3 = (ulong)(ushort)(*local_40 << 8 | *local_40 >> 8);
        local_40 = local_40 + 1;
        if (uVar3 <= (ulong)((long)end_00 - (long)local_40)) {
          psk->base = (uint8_t *)local_40;
          local_40 = (ushort *)((long)local_40 + uVar3);
          psk->len = uVar3;
          if (1 < (long)end_00 - (long)local_40) {
            *csid = *local_40 << 8 | *local_40 >> 8;
            local_40 = local_40 + 1;
            iVar2 = decode32(ticket_age_add,(uint8_t **)&local_40,end_00);
            if ((iVar2 == 0) && (iVar2 = iVar1, 1 < (ulong)((long)end_00 - (long)local_40))) {
              uVar3 = (ulong)(ushort)(*local_40 << 8 | *local_40 >> 8);
              local_40 = local_40 + 1;
              if (uVar3 <= (ulong)((long)end_00 - (long)local_40)) {
                local_38->base = (uint8_t *)local_40;
                local_38->len = uVar3;
                iVar2 = 0x32;
                if ((uint8_t *)(uVar3 + (long)local_40) == end &&
                    end_00 == (uint8_t *)(uVar3 + (long)local_40)) {
                  iVar2 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int decode_session_identifier(uint64_t *issued_at, ptls_iovec_t *psk, uint32_t *ticket_age_add, ptls_iovec_t *server_name,
                              uint16_t *csid, const uint8_t *src, const uint8_t *end)
{
    int ret = 0;

    decode_block(src, end, 2, {
        if ((ret = decode64(issued_at, &src, end)) != 0)
            goto Exit;
        decode_open_block(src, end, 2, {
            *psk = ptls_iovec_init(src, end - src);
            src = end;
        });
        if ((ret = decode16(csid, &src, end)) != 0)
            goto Exit;
        if ((ret = decode32(ticket_age_add, &src, end)) != 0)
            goto Exit;
        decode_open_block(src, end, 2, {
            *server_name = ptls_iovec_init(src, end - src);
            src = end;
        });
    });

Exit:
    return ret;
}